

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vi.c
# Opt level: O0

el_action_t vi_history_word(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  int iVar3;
  wchar_t wVar4;
  bool bVar5;
  wchar_t *local_60;
  wchar_t *local_58;
  wchar_t *lim;
  wchar_t *cp;
  wchar_t *pwStack_38;
  wchar_t len;
  wchar_t *wsp;
  wchar_t *wep;
  wchar_t *wp;
  wint_t c_local;
  EditLine *el_local;
  
  if ((el->el_flags & 0x40U) == 0) {
    wVar4 = (*(el->el_history).fun)((el->el_history).ref,&(el->el_history).ev,L'\x03',0);
    if (wVar4 == L'\xffffffff') {
      local_60 = (wchar_t *)0x0;
    }
    else {
      local_60 = (el->el_history).ev.str;
    }
    local_58 = local_60;
  }
  else {
    local_58 = hist_convert(el,L'\x03',(void *)0x0);
  }
  wep = local_58;
  if (local_58 == (wchar_t *)0x0) {
    el_local._7_1_ = '\x06';
  }
  else {
    pwStack_38 = (wchar_t *)0x0;
    wsp = (wchar_t *)0x0;
    do {
      while (iVar3 = iswspace(*wep), iVar3 != 0) {
        wep = wep + 1;
      }
      if (*wep == L'\0') break;
      pwStack_38 = wep;
      while( true ) {
        bVar5 = false;
        if (*wep != L'\0') {
          iVar3 = iswspace(*wep);
          bVar5 = iVar3 == 0;
        }
        if (!bVar5) break;
        wep = wep + 1;
      }
      wsp = wep;
      if ((el->el_state).doingarg == L'\0') {
LAB_0012fb2f:
        bVar5 = *wep != L'\0';
      }
      else {
        wVar4 = (el->el_state).argument + L'\xffffffff';
        (el->el_state).argument = wVar4;
        bVar5 = false;
        if (L'\0' < wVar4) goto LAB_0012fb2f;
      }
    } while (bVar5);
    if ((pwStack_38 == (wchar_t *)0x0) ||
       (((el->el_state).doingarg != L'\0' && ((el->el_state).argument != L'\0')))) {
      el_local._7_1_ = '\x06';
    }
    else {
      cv_undo(el);
      if ((el->el_line).cursor < (el->el_line).lastchar) {
        (el->el_line).cursor = (el->el_line).cursor + 1;
      }
      c_insert(el,(int)((long)wsp - (long)pwStack_38 >> 2) + L'\x01');
      pwVar1 = (el->el_line).cursor;
      pwVar2 = (el->el_line).limit;
      lim = pwVar1;
      if (pwVar1 < pwVar2) {
        lim = pwVar1 + 1;
        *pwVar1 = L' ';
      }
      while (pwStack_38 < wsp && lim < pwVar2) {
        *lim = *pwStack_38;
        lim = lim + 1;
        pwStack_38 = pwStack_38 + 1;
      }
      (el->el_line).cursor = lim;
      (el->el_map).current = (el->el_map).key;
      el_local._7_1_ = '\x04';
    }
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
vi_history_word(EditLine *el, wint_t c __attribute__((__unused__)))
{
	const wchar_t *wp = HIST_FIRST(el);
	const wchar_t *wep, *wsp;
	int len;
	wchar_t *cp;
	const wchar_t *lim;

	if (wp == NULL)
		return CC_ERROR;

	wep = wsp = NULL;
	do {
		while (iswspace(*wp))
			wp++;
		if (*wp == 0)
			break;
		wsp = wp;
		while (*wp && !iswspace(*wp))
			wp++;
		wep = wp;
	} while ((!el->el_state.doingarg || --el->el_state.argument > 0)
	    && *wp != 0);

	if (wsp == NULL || (el->el_state.doingarg && el->el_state.argument != 0))
		return CC_ERROR;

	cv_undo(el);
	len = (int)(wep - wsp);
	if (el->el_line.cursor < el->el_line.lastchar)
		el->el_line.cursor++;
	c_insert(el, len + 1);
	cp = el->el_line.cursor;
	lim = el->el_line.limit;
	if (cp < lim)
		*cp++ = ' ';
	while (wsp < wep && cp < lim)
		*cp++ = *wsp++;
	el->el_line.cursor = cp;

	el->el_map.current = el->el_map.key;
	return CC_REFRESH;
}